

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O3

void duckdb::TimeTZAverageOperation::
     Operation<duckdb::dtime_tz_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::TimeTZAverageOperation>
               (AvgState<duckdb::hugeint_t> *state,dtime_tz_t *input,AggregateUnaryInput *aggr_unary
               )

{
  int64_t *piVar1;
  dtime_t dVar2;
  ulong uVar3;
  
  dVar2 = Time::NormalizeTimeTZ((dtime_tz_t)input->bits);
  state->count = state->count + 1;
  uVar3 = (state->value).lower + dVar2.micros;
  (state->value).lower = uVar3;
  if (-1 < dVar2.micros != (ulong)dVar2.micros <= uVar3) {
    piVar1 = &(state->value).upper;
    *piVar1 = *piVar1 + (dVar2.micros >> 0x3f | 1U);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &aggr_unary) {
		const auto micros = Time::NormalizeTimeTZ(input).micros;
		AverageSetOperation::template AddValues<STATE>(state, 1);
		AddToHugeint::template AddNumber<STATE, int64_t>(state, micros);
	}